

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O2

int flatcc_verify_buffer_header_with_size(void *buf,size_t *bufsiz,char *fid)

{
  uint uVar1;
  ulong uVar2;
  flatbuffers_thash_t fVar3;
  int iVar4;
  
  if (((ulong)buf & 3) == 0) {
    uVar2 = *bufsiz;
    if (uVar2 >> 3 < 0x1fffffff) {
      if (uVar2 < 0xc) {
        iVar4 = 1;
      }
      else {
        uVar1 = *buf;
        if (uVar2 - 4 < (ulong)uVar1) {
          iVar4 = 0x24;
        }
        else if (((fid == (char *)0x0) || (fVar3 = read_thash_identifier(fid), fVar3 == 0)) ||
                (*(flatbuffers_thash_t *)((long)buf + 4) == fVar3)) {
          *bufsiz = (ulong)uVar1 + 4;
          iVar4 = 0;
        }
        else {
          iVar4 = 2;
        }
      }
    }
    else {
      iVar4 = 6;
    }
  }
  else {
    iVar4 = 5;
  }
  return iVar4;
}

Assistant:

int flatcc_verify_buffer_header_with_size(const void *buf, size_t *bufsiz, const char *fid)
{
    thash_t id, id2;
    size_t size_field;

    verify_runtime(!(((size_t)buf) & (offset_size - 1)), flatcc_verify_error_runtime_buffer_header_not_aligned);
    /* -8 ensures no scalar or offset field size can overflow. */
    verify_runtime(*bufsiz <= FLATBUFFERS_UOFFSET_MAX - 8, flatcc_verify_error_runtime_buffer_size_too_large);

    /* Size field, offset field, optional identifier field that must be read even if not present. */
    verify(*bufsiz >= 2 * offset_size + FLATBUFFERS_IDENTIFIER_SIZE, flatcc_verify_error_buffer_header_too_small);

    size_field = (size_t)read_uoffset(buf, 0);
    verify_runtime(size_field <= *bufsiz - offset_size, flatcc_verify_error_runtime_buffer_size_less_than_size_field);
    if (fid != 0) {
        id2 = read_thash_identifier(fid);
        id = read_thash(buf, offset_size);
        verify(id2 == 0 || id == id2, flatcc_verify_error_identifier_mismatch);
    }
    *bufsiz = size_field + offset_size;
    return flatcc_verify_ok;
}